

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufUnpackEncTable(char **pcode,int ni,int im,int iM,longlong *hcode)

{
  char *pcVar1;
  longlong lVar2;
  int local_58;
  int local_54;
  int zerun_1;
  int zerun;
  longlong l;
  longlong lStack_40;
  int lc;
  longlong c;
  char *p;
  longlong *hcode_local;
  int local_20;
  int iM_local;
  int im_local;
  int ni_local;
  char **pcode_local;
  
  p = (char *)hcode;
  hcode_local._4_4_ = iM;
  local_20 = im;
  iM_local = ni;
  _im_local = pcode;
  memset(hcode,0,0x80008);
  c = (longlong)*_im_local;
  lStack_40 = 0;
  l._4_4_ = 0;
  do {
    if (hcode_local._4_4_ < local_20) {
      *_im_local = (char *)c;
      hufCanonicalCodeTable((longlong *)p);
      return true;
    }
    if ((long)iM_local <= c - (long)*_im_local) {
      return false;
    }
    lVar2 = getBits(6,&stack0xffffffffffffffc0,(int *)((long)&l + 4),(char **)&c);
    *(longlong *)(p + (long)local_20 * 8) = lVar2;
    if (lVar2 == 0x3f) {
      if ((long)iM_local < c - (long)*_im_local) {
        return false;
      }
      lVar2 = getBits(8,&stack0xffffffffffffffc0,(int *)((long)&l + 4),(char **)&c);
      local_54 = (int)lVar2 + 6;
      if (hcode_local._4_4_ + 1 < local_20 + local_54) {
        return false;
      }
      while (local_54 != 0) {
        pcVar1 = p + (long)local_20 * 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        local_54 = local_54 + -1;
        local_20 = local_20 + 1;
      }
      local_20 = local_20 + -1;
    }
    else if (0x3a < lVar2) {
      local_58 = (int)lVar2 + -0x39;
      if (hcode_local._4_4_ + 1 < local_20 + local_58) {
        return false;
      }
      while (local_58 != 0) {
        pcVar1 = p + (long)local_20 * 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        local_58 = local_58 + -1;
        local_20 = local_20 + 1;
      }
      local_20 = local_20 + -1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static bool hufUnpackEncTable(
    const char **pcode,  // io: ptr to packed table (updated)
    int ni,              // i : input size (in bytes)
    int im,              // i : min hcode index
    int iM,              // i : max hcode index
    long long *hcode)    //  o: encoding table [HUF_ENCSIZE]
{
  memset(hcode, 0, sizeof(long long) * HUF_ENCSIZE);

  const char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    if (p - *pcode >= ni) {
      return false;
    }

    long long l = hcode[im] = getBits(6, c, lc, p);  // code length

    if (l == (long long)LONG_ZEROCODE_RUN) {
      if (p - *pcode > ni) {
        return false;
      }

      int zerun = getBits(8, c, lc, p) + SHORTEST_LONG_RUN;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    } else if (l >= (long long)SHORT_ZEROCODE_RUN) {
      int zerun = l - SHORT_ZEROCODE_RUN + 2;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    }
  }

  *pcode = const_cast<char *>(p);

  hufCanonicalCodeTable(hcode);

  return true;
}